

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::MonitorTask::checkArguments
          (MonitorTask *this,ASTContext *context,Args *args,SourceRange range,Expression *iterOrThis
          )

{
  Compilation *pCVar1;
  Type *this_00;
  pointer ppEVar2;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  MonitorVisitor visitor;
  MonitorVisitor local_30;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar4 = FmtHelpers::checkDisplayArgs(context,args);
  this_00 = pCVar1->scalarTypeTable[(ulong)!bVar4 + 0x10];
  bVar4 = Type::isError(this_00);
  if (!bVar4) {
    ppEVar2 = args->_M_ptr;
    sVar3 = (args->_M_extent)._M_extent_value;
    local_30.context = context;
    for (lVar5 = 0; sVar3 << 3 != lVar5; lVar5 = lVar5 + 8) {
      Expression::visit<slang::ast::builtins::MonitorVisitor&>
                (*(Expression **)((long)ppEVar2 + lVar5),&local_30);
    }
  }
  return this_00;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterOrThis) const final {
        auto& result = DisplayTask::checkArguments(context, args, range, iterOrThis);
        if (result.isError())
            return result;

        // Additional restriction for monitor tasks: automatic variables cannot be referenced.
        MonitorVisitor visitor(context);
        for (auto arg : args)
            arg->visit(visitor);

        return result;
    }